

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilities.cpp
# Opt level: O2

string * getFirstToken(string *__return_storage_ptr__,string *input)

{
  ulong uVar1;
  int i;
  long lVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  lVar2 = 0;
  while ((uVar1 = (ulong)(byte)(input->_M_dataplus)._M_p[lVar2], 0x20 < uVar1 ||
         ((0x100000201U >> (uVar1 & 0x3f) & 1) == 0))) {
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
    lVar2 = lVar2 + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

std::string getFirstToken(std::string input) {
  std::string returnString;
  for(int i = 0; input[i] != ' ' && input[i] != '\0' && input[i] != '\t'; i++) {
    returnString += input[i];
  }
  return returnString;
}